

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

iterator divsufsortxx::helper::
         median5<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                   (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator v1,
                   iterator v2,iterator v3,iterator v4,iterator v5)

{
  pos_type *__a;
  undefined8 uVar1;
  undefined8 uVar2;
  value_type vVar3;
  value_type vVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  pos_type *ppVar7;
  pos_type in_RCX;
  BitmapArray<long> *in_RDX;
  pos_type pVar8;
  pos_type in_RSI;
  BitmapArray<long> *in_RDI;
  BitmapArray<long> *in_R8;
  pos_type in_R9;
  BitmapArray<long> *pBVar9;
  iterator *piVar10;
  iterator iVar11;
  undefined8 in_stack_00000038;
  undefined1 local_70 [16];
  iterator local_60;
  iterator local_50;
  BitmapArray<long> *local_40;
  pos_type local_38;
  
  local_70._0_8_ = in_R8;
  local_70._8_8_ = in_R9;
  local_50.array_ = in_RDI;
  local_50.pos_ = in_RSI;
  local_40 = in_RDI;
  local_38 = in_RSI;
  iVar5 = (*(in_RDX->super_Bitmap)._vptr_Bitmap[5])();
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,
                     CONCAT44(extraout_var,iVar5));
  iVar5 = (*(in_R8->super_Bitmap)._vptr_Bitmap[5])();
  vVar4 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,
                     CONCAT44(extraout_var_00,iVar5));
  pVar8 = in_RCX;
  pBVar9 = in_RDX;
  if (vVar4 < vVar3) {
    pVar8 = in_R9;
    pBVar9 = in_R8;
    local_70._0_8_ = in_RDX;
    local_70._8_8_ = in_RCX;
  }
  __a = &v2.pos_;
  sVar6 = (**(code **)(*(long *)v2.pos_ + 0x28))(v2.pos_,v1.array_);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,sVar6);
  ppVar7 = &v1.pos_;
  sVar6 = (**(code **)(*(long *)v1.pos_ + 0x28))(v1.pos_,in_stack_00000038);
  vVar4 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,sVar6);
  if (vVar4 < vVar3) {
    std::swap<bitmap::BitmapArray<long>::iterator>((iterator *)__a,(iterator *)ppVar7);
  }
  iVar5 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pVar8);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,
                     CONCAT44(extraout_var_01,iVar5));
  sVar6 = (**(code **)(*(long *)v2.pos_ + 0x28))(v2.pos_,v1.array_);
  vVar4 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,sVar6);
  if (vVar4 < vVar3) {
    std::swap<bitmap::BitmapArray<long>::iterator>(&local_60,(iterator *)__a);
    std::swap<bitmap::BitmapArray<long>::iterator>((iterator *)local_70,(iterator *)ppVar7);
  }
  iVar5 = (*(local_40->super_Bitmap)._vptr_Bitmap[5])(local_40,local_38);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,
                     CONCAT44(extraout_var_02,iVar5));
  iVar5 = (*((Bitmap *)local_70._0_8_)->_vptr_Bitmap[5])(local_70._0_8_,local_70._8_8_);
  vVar4 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,
                     CONCAT44(extraout_var_03,iVar5));
  uVar2 = local_70._8_8_;
  uVar1 = local_70._0_8_;
  if (vVar4 < vVar3) {
    local_50.array_ = (BitmapArray<long> *)local_70._0_8_;
    local_50.pos_ = local_70._8_8_;
    local_70._0_8_ = local_40;
    local_70._8_8_ = local_38;
    local_40 = (BitmapArray<long> *)uVar1;
    local_38 = uVar2;
  }
  iVar5 = (*(local_40->super_Bitmap)._vptr_Bitmap[5])(local_40,local_38);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,
                     CONCAT44(extraout_var_04,iVar5));
  sVar6 = (**(code **)(*(long *)v2.pos_ + 0x28))(v2.pos_,v1.array_);
  vVar4 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,sVar6);
  if (vVar4 < vVar3) {
    std::swap<bitmap::BitmapArray<long>::iterator>(&local_50,(iterator *)__a);
    std::swap<bitmap::BitmapArray<long>::iterator>((iterator *)local_70,(iterator *)ppVar7);
  }
  iVar5 = (*((Bitmap *)local_70._0_8_)->_vptr_Bitmap[5])(local_70._0_8_,local_70._8_8_);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,
                     CONCAT44(extraout_var_05,iVar5));
  sVar6 = (**(code **)(*(long *)v2.pos_ + 0x28))(v2.pos_,v1.array_);
  vVar4 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    ((substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&v3,sVar6);
  piVar10 = &v1;
  if (vVar3 <= vVar4) {
    piVar10 = (iterator *)(local_70 + 8);
  }
  ppVar7 = (pos_type *)local_70;
  if (vVar4 < vVar3) {
    ppVar7 = __a;
  }
  iVar11.pos_ = (pos_type)piVar10->array_;
  iVar11.array_ = (BitmapArray<long> *)*ppVar7;
  return iVar11;
}

Assistant:

SAIterator_type median5(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3,
                        SAIterator_type v4, SAIterator_type v5) {
  if (Td[*v2] > Td[*v3]) {
    std::swap(v2, v3);
  }
  if (Td[*v4] > Td[*v5]) {
    std::swap(v4, v5);
  }
  if (Td[*v2] > Td[*v4]) {
    std::swap(v2, v4);
    std::swap(v3, v5);
  }
  if (Td[*v1] > Td[*v3]) {
    std::swap(v1, v3);
  }
  if (Td[*v1] > Td[*v4]) {
    std::swap(v1, v4);
    std::swap(v3, v5);
  }
  if (Td[*v3] > Td[*v4]) {
    return v4;
  }
  return v3;
}